

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

counting_iterator __thiscall
duckdb_fmt::v6::internal::float_writer<wchar_t>::
prettify<duckdb_fmt::v6::internal::counting_iterator>
          (float_writer<wchar_t> *this,counting_iterator it)

{
  counting_iterator it_00;
  counting_iterator it_01;
  counting_iterator it_02;
  counting_iterator it_03;
  counting_iterator it_04;
  counting_iterator it_05;
  counting_iterator it_06;
  int *piVar1;
  counting_iterator cVar2;
  size_t in_RSI;
  long *in_RDI;
  bool bVar3;
  int num_digits_1;
  int num_zeros_3;
  int num_zeros_2;
  int num_digits;
  int i_1;
  int digit_count_1;
  int num_zeros_1;
  int write_count;
  int i;
  int digit_count;
  bool trailing_zeros;
  int num_zeros;
  int full_exp;
  counting_iterator *in_stack_fffffffffffffd48;
  char *in_stack_fffffffffffffd50;
  wchar_t *pwVar4;
  undefined7 in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd5f;
  wchar_t *in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd74;
  counting_iterator in_stack_fffffffffffffd78;
  int local_280;
  char local_279;
  byte local_269;
  counting_iterator local_230;
  value_type local_225;
  int local_224;
  int local_220;
  int in_stack_fffffffffffffde4;
  counting_iterator in_stack_fffffffffffffde8;
  value_type local_209;
  wchar_t local_208 [2];
  size_t local_200;
  int local_1ec;
  size_t local_1e8;
  size_t local_1e0;
  counting_iterator local_1d0;
  value_type local_1c1;
  size_t local_1c0;
  counting_iterator local_1b0;
  value_type local_1a5;
  int local_1a4;
  size_t local_198;
  size_t local_190;
  size_t local_188;
  counting_iterator local_178;
  value_type local_16e;
  char local_16d;
  int local_16c;
  int local_168;
  undefined4 local_164;
  size_t local_160;
  counting_iterator local_148;
  value_type local_13d;
  wchar_t local_13c;
  int local_138;
  counting_iterator local_130;
  value_type local_125;
  undefined4 local_124;
  size_t local_120;
  size_t local_118;
  size_t local_108;
  undefined4 local_fc;
  size_t local_f8;
  size_t local_f0;
  undefined4 local_e4;
  size_t local_e0;
  size_t local_d8;
  size_t local_d0;
  size_t local_c8;
  int local_bc;
  int local_b8;
  counting_iterator local_b0;
  value_type local_a2;
  char local_a1;
  int local_a0;
  int local_9c;
  size_t local_98;
  counting_iterator local_88;
  value_type local_79;
  wchar_t local_78 [2];
  size_t local_70;
  size_t local_68;
  size_t local_60;
  size_t local_58;
  counting_iterator local_48;
  value_type local_3a;
  byte local_39;
  int local_38;
  counting_iterator local_30;
  value_type local_21;
  wchar_t local_20;
  int local_1c;
  size_t local_10;
  size_t local_8;
  
  local_1c = (int)in_RDI[1] + *(int *)((long)in_RDI + 0xc);
  local_10 = in_RSI;
  if ((char)*(undefined4 *)((long)in_RDI + 0x1c) == '\x01') {
    local_20 = (wchar_t)*(char *)*in_RDI;
    local_30 = counting_iterator::operator++(in_stack_fffffffffffffd48,0);
    counting_iterator::operator*(&local_30);
    counting_iterator::value_type::operator=(&local_21,&local_20);
    local_38 = (int)in_RDI[3] - (int)in_RDI[1];
    local_269 = 0;
    if (0 < local_38) {
      local_269 = (byte)((uint)*(undefined4 *)((long)in_RDI + 0x1c) >> 0x1d) & 1;
    }
    local_39 = local_269;
    if ((1 < (int)in_RDI[1]) || (local_269 != 0)) {
      local_48 = counting_iterator::operator++(in_stack_fffffffffffffd48,0);
      counting_iterator::operator*(&local_48);
      counting_iterator::value_type::operator=(&local_3a,(wchar_t *)(in_RDI + 4));
    }
    local_60 = local_10;
    it_00.count_._7_1_ = in_stack_fffffffffffffd5f;
    it_00.count_._0_7_ = in_stack_fffffffffffffd58;
    local_58 = (size_t)copy_str<wchar_t,_const_char_*,_duckdb_fmt::v6::internal::counting_iterator,_0>
                                 (in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,it_00)
    ;
    local_10 = local_58;
    if ((local_39 & 1) != 0) {
      local_78[1] = 0x30;
      local_70 = local_58;
      local_68 = (size_t)std::fill_n<duckdb_fmt::v6::internal::counting_iterator,int,wchar_t>
                                   (in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                                    in_stack_fffffffffffffd68);
      local_10 = local_68;
    }
    local_279 = 'E';
    if ((*(uint *)((long)in_RDI + 0x1c) & 0x1000000) == 0) {
      local_279 = 'e';
    }
    local_78[0] = (wchar_t)local_279;
    local_88 = counting_iterator::operator++(in_stack_fffffffffffffd48,0);
    counting_iterator::operator*(&local_88);
    counting_iterator::value_type::operator=(&local_79,local_78);
    local_98 = local_10;
    local_8 = (size_t)write_exponent<wchar_t,duckdb_fmt::v6::internal::counting_iterator>
                                (in_stack_fffffffffffffde4,in_stack_fffffffffffffde8);
  }
  else {
    if (local_1c < (int)in_RDI[1]) {
      if (local_1c < 1) {
        local_208[0] = L'0';
        counting_iterator::operator++(in_stack_fffffffffffffd48,0);
        counting_iterator::operator*((counting_iterator *)&stack0xfffffffffffffde8);
        counting_iterator::value_type::operator=(&local_209,local_208);
        local_220 = -local_1c;
        if ((((int)in_RDI[1] == 0) && (-1 < (int)in_RDI[3])) && ((int)in_RDI[3] < local_220)) {
          local_220 = (int)in_RDI[3];
        }
        local_224 = (int)in_RDI[1];
        if ((*(uint *)((long)in_RDI + 0x1c) >> 0x1d & 1) == 0) {
          while( true ) {
            bVar3 = false;
            if (0 < local_224) {
              bVar3 = *(char *)(*in_RDI + (long)(local_224 + -1)) == '0';
            }
            if (!bVar3) break;
            local_224 = local_224 + -1;
          }
          in_stack_fffffffffffffd5f = 0;
        }
        if ((local_220 != 0) || (local_224 != 0)) {
          pwVar4 = (wchar_t *)(in_RDI + 4);
          local_230 = counting_iterator::operator++(in_stack_fffffffffffffd48,0);
          counting_iterator::operator*(&local_230);
          counting_iterator::value_type::operator=(&local_225,pwVar4);
          local_10 = (size_t)std::fill_n<duckdb_fmt::v6::internal::counting_iterator,int,wchar_t>
                                       (in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                                        in_stack_fffffffffffffd68);
          cVar2.count_._7_1_ = in_stack_fffffffffffffd5f;
          cVar2.count_._0_7_ = in_stack_fffffffffffffd58;
          local_10 = (size_t)copy_str<wchar_t,_const_char_*,_duckdb_fmt::v6::internal::counting_iterator,_0>
                                       ((char *)pwVar4,(char *)in_stack_fffffffffffffd48,cVar2);
        }
      }
      else {
        if (((char)((uint)*(undefined4 *)((long)in_RDI + 0x1c) >> 0x10) == '\0') || (local_1c < 4))
        {
          it_04.count_._7_1_ = in_stack_fffffffffffffd5f;
          it_04.count_._0_7_ = in_stack_fffffffffffffd58;
          local_198 = (size_t)copy_str<wchar_t,_const_char_*,_duckdb_fmt::v6::internal::counting_iterator,_0>
                                        (in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48
                                         ,it_04);
          local_10 = local_198;
        }
        else {
          if (local_1c % 3 == 0) {
            in_stack_fffffffffffffd74 = 3;
          }
          else {
            in_stack_fffffffffffffd74 = local_1c % 3;
          }
          local_16c = 0;
          local_168 = in_stack_fffffffffffffd74;
          while (local_16c < local_1c) {
            if (0 < local_16c) {
              local_16d = (char)((uint)*(undefined4 *)((long)in_RDI + 0x1c) >> 0x10);
              local_178 = counting_iterator::operator++(in_stack_fffffffffffffd48,0);
              counting_iterator::operator*(&local_178);
              counting_iterator::value_type::operator=(&local_16e,&local_16d);
            }
            local_190 = local_10;
            it_03.count_._7_1_ = in_stack_fffffffffffffd5f;
            it_03.count_._0_7_ = in_stack_fffffffffffffd58;
            local_188 = (size_t)copy_str<wchar_t,_const_char_*,_duckdb_fmt::v6::internal::counting_iterator,_0>
                                          (in_stack_fffffffffffffd50,
                                           (char *)in_stack_fffffffffffffd48,it_03);
            local_16c = local_168 + local_16c;
            local_168 = 3;
            local_10 = local_188;
          }
        }
        if ((*(uint *)((long)in_RDI + 0x1c) >> 0x1d & 1) == 0) {
          local_1a4 = (int)in_RDI[1];
          while( true ) {
            bVar3 = false;
            if (local_1c < local_1a4) {
              bVar3 = *(char *)(*in_RDI + (long)(local_1a4 + -1)) == '0';
            }
            if (!bVar3) break;
            local_1a4 = local_1a4 + -1;
          }
          if (local_1a4 != local_1c) {
            pwVar4 = (wchar_t *)(in_RDI + 4);
            local_1b0 = counting_iterator::operator++(in_stack_fffffffffffffd48,0);
            counting_iterator::operator*(&local_1b0);
            counting_iterator::value_type::operator=(&local_1a5,pwVar4);
          }
          local_1c0 = local_10;
          it_05.count_._7_1_ = in_stack_fffffffffffffd5f;
          it_05.count_._0_7_ = in_stack_fffffffffffffd58;
          cVar2 = copy_str<wchar_t,_const_char_*,_duckdb_fmt::v6::internal::counting_iterator,_0>
                            (in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,it_05);
          return (counting_iterator)cVar2.count_;
        }
        local_1d0 = counting_iterator::operator++(in_stack_fffffffffffffd48,0);
        counting_iterator::operator*(&local_1d0);
        counting_iterator::value_type::operator=(&local_1c1,(wchar_t *)(in_RDI + 4));
        local_1e8 = local_10;
        it_06.count_._7_1_ = in_stack_fffffffffffffd5f;
        it_06.count_._0_7_ = in_stack_fffffffffffffd58;
        local_200 = (size_t)copy_str<wchar_t,_const_char_*,_duckdb_fmt::v6::internal::counting_iterator,_0>
                                      (in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,
                                       it_06);
        local_10 = local_200;
        if ((int)in_RDI[1] < (int)in_RDI[3]) {
          local_1ec = (int)in_RDI[3] - (int)in_RDI[1];
          local_208[1] = 0x30;
          local_1e0 = local_200;
          local_10 = (size_t)std::fill_n<duckdb_fmt::v6::internal::counting_iterator,int,wchar_t>
                                       (in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                                        in_stack_fffffffffffffd68);
        }
      }
    }
    else {
      if (((char)((uint)*(undefined4 *)((long)in_RDI + 0x1c) >> 0x10) == '\0') || (local_1c < 4)) {
        it_02.count_._7_1_ = in_stack_fffffffffffffd5f;
        it_02.count_._0_7_ = in_stack_fffffffffffffd58;
        local_120 = (size_t)copy_str<wchar_t,_const_char_*,_duckdb_fmt::v6::internal::counting_iterator,_0>
                                      (in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,
                                       it_02);
        local_124 = 0x30;
        local_108 = local_120;
        local_10 = local_120;
        local_118 = (size_t)std::fill_n<duckdb_fmt::v6::internal::counting_iterator,int,wchar_t>
                                      (in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                                       in_stack_fffffffffffffd68);
        local_10 = local_118;
      }
      else {
        if (local_1c % 3 == 0) {
          local_280 = 3;
        }
        else {
          local_280 = local_1c % 3;
        }
        local_9c = local_280;
        local_a0 = 0;
        while (local_a0 < local_1c) {
          if (0 < local_a0) {
            local_a1 = (char)((uint)*(undefined4 *)((long)in_RDI + 0x1c) >> 0x10);
            local_b0 = counting_iterator::operator++(in_stack_fffffffffffffd48,0);
            counting_iterator::operator*(&local_b0);
            counting_iterator::value_type::operator=(&local_a2,&local_a1);
          }
          if (local_a0 < (int)in_RDI[1]) {
            local_bc = (int)in_RDI[1] - local_a0;
            piVar1 = std::min<int>(&local_bc,&local_9c);
            local_b8 = *piVar1;
            local_d0 = local_10;
            it_01.count_._7_1_ = in_stack_fffffffffffffd5f;
            it_01.count_._0_7_ = in_stack_fffffffffffffd58;
            local_c8 = (size_t)copy_str<wchar_t,_const_char_*,_duckdb_fmt::v6::internal::counting_iterator,_0>
                                         (in_stack_fffffffffffffd50,
                                          (char *)in_stack_fffffffffffffd48,it_01);
            local_10 = local_c8;
            if (local_b8 < local_9c) {
              local_e4 = 0x30;
              local_e0 = local_c8;
              local_d8 = (size_t)std::
                                 fill_n<duckdb_fmt::v6::internal::counting_iterator,int,wchar_t>
                                           (in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                                            in_stack_fffffffffffffd68);
              local_10 = local_d8;
            }
          }
          else {
            local_f8 = local_10;
            local_fc = 0x30;
            local_f0 = (size_t)std::fill_n<duckdb_fmt::v6::internal::counting_iterator,int,wchar_t>
                                         (in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                                          in_stack_fffffffffffffd68);
            local_10 = local_f0;
          }
          local_a0 = local_9c + local_a0;
          local_9c = 3;
        }
      }
      if ((*(uint *)((long)in_RDI + 0x1c) >> 0x1d & 1) != 0) {
        cVar2.count_ = (size_t)(in_RDI + 4);
        local_130 = counting_iterator::operator++(in_stack_fffffffffffffd48,0);
        counting_iterator::operator*(&local_130);
        counting_iterator::value_type::operator=(&local_125,(wchar_t *)cVar2.count_);
        local_138 = (int)in_RDI[3] - local_1c;
        if (local_138 < 1) {
          if ((char)*(undefined4 *)((long)in_RDI + 0x1c) != '\x02') {
            local_13c = L'0';
            local_148 = counting_iterator::operator++(in_stack_fffffffffffffd48,0);
            counting_iterator::operator*(&local_148);
            counting_iterator::value_type::operator=(&local_13d,&local_13c);
          }
          return (counting_iterator)local_10;
        }
        local_160 = local_10;
        local_164 = 0x30;
        local_10 = (size_t)std::fill_n<duckdb_fmt::v6::internal::counting_iterator,int,wchar_t>
                                     (cVar2,in_stack_fffffffffffffd74,in_stack_fffffffffffffd68);
      }
    }
    local_8 = local_10;
  }
  return (counting_iterator)local_8;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      bool trailing_zeros = num_zeros > 0 && specs_.trailing_zeros;
      if (num_digits_ > 1 || trailing_zeros) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (trailing_zeros)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      if (specs_.thousand_sep != '\0' && full_exp > 3) {
        // thousand separator
        // we need to print the thousand separator every 3 digits
        // the loop is essentially write 3 digits, write the thousand separator
        // the exception is the first batch of digits which are 1-3 digits
        int digit_count = full_exp % 3 == 0 ? 3 : full_exp % 3;
        for(int i = 0; i < full_exp; i += digit_count, digit_count = 3) {
          if (i > 0) {
            *it++ = specs_.thousand_sep;
          }
          if (i < num_digits_) {
            // we still need to write digits
            int write_count = std::min<int>(num_digits_ - i, digit_count);
            it = copy_str<Char>(digits_ + i, digits_ + i + write_count, it);
            if (write_count < digit_count) {
              // write any trailing zeros that belong to this batch
              it = std::fill_n(it, digit_count - write_count, static_cast<Char>('0'));
            }
          } else {
            // we only need to write trailing zeros
            it = std::fill_n(it, digit_count, static_cast<Char>('0'));
          }
        }
      } else {
        it = copy_str<Char>(digits_, digits_ + num_digits_, it);
        it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      }
      if (specs_.trailing_zeros) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      if (specs_.thousand_sep != '\0' && full_exp > 3) {
        // thousand separator
        // we need to print the thousand separator every 3 digits
        // the loop is essentially write 3 digits, write the thousand separator
        // the exception is the first batch of digits which are 1-3 digits
        int digit_count = full_exp % 3 == 0 ? 3 : full_exp % 3;
        for(int i = 0; i < full_exp; i += digit_count, digit_count = 3) {
          if (i > 0) {
            *it++ = specs_.thousand_sep;
          }
          it = copy_str<Char>(digits_ + i, digits_ + i + digit_count, it);
        }
      } else {
        it = copy_str<Char>(digits_, digits_ + full_exp, it);
      }
      if (!specs_.trailing_zeros) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      if (num_digits_ == 0 && specs_.precision >= 0 && specs_.precision < num_zeros)
        num_zeros = specs_.precision;
      int num_digits = num_digits_;
      if (!specs_.trailing_zeros)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }